

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Parser::parse_array(Parser *this)

{
  Type TVar1;
  pointer pTVar2;
  pointer pTVar3;
  AbstractSyntaxNode *pAVar4;
  ostream *poVar5;
  parser_exception *this_00;
  int iVar6;
  Token *pTVar7;
  string local_338;
  TokenPosition local_318;
  Token local_300;
  Token local_2a8;
  Token local_250;
  Token local_1f8;
  stringstream buffer;
  ostream local_190 [376];
  
  _buffer = 0x3e;
  pAVar4 = AbstractSyntaxNode::add_child
                     (this->current_,(Type *)&buffer,
                      (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                      super__Vector_impl_data._M_start + this->index_ % this->total_);
  this->current_ = pAVar4;
  std::__cxx11::stringstream::stringstream((stringstream *)&buffer);
  local_338._M_dataplus._M_p._0_4_ = 0xd;
  match(&local_1f8,this,(Type *)&local_338);
  Token::~Token(&local_1f8);
  iVar6 = this->index_ % this->total_;
  pTVar2 = (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar7 = pTVar2 + iVar6;
  TVar1 = pTVar2[iVar6].type_;
  if (TVar1 == kIdentity) {
    AbstractSyntaxNode::add_child(this->current_,pTVar7);
    local_338._M_dataplus._M_p._0_4_ = 0x21;
    match(&local_2a8,this,(Type *)&local_338);
    pTVar7 = &local_2a8;
  }
  else {
    if (TVar1 != kIntegerLiteral) {
      poVar5 = std::operator<<(local_190,anon_var_dwarf_77bb8);
      Token::content_abi_cxx11_
                (&local_338,
                 (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                 super__Vector_impl_data._M_start + this->index_ % this->total_);
      poVar5 = std::operator<<(poVar5,(string *)&local_338);
      std::operator<<(poVar5,anon_var_dwarf_77c60);
      std::__cxx11::string::~string((string *)&local_338);
      this_00 = (parser_exception *)__cxa_allocate_exception(0x40);
      iVar6 = this->index_ % this->total_;
      pTVar2 = (this->lookahead_).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      pTVar3 = pTVar2 + iVar6;
      local_318.super_Position.row_ = (pTVar3->position_).super_Position.row_;
      local_318.super_Position.col_ = (pTVar3->position_).super_Position.col_;
      local_318.super_Position._vptr_Position = (_func_int **)&PTR_clear_001599f0;
      local_318.length_ = pTVar2[iVar6].position_.length_;
      std::__cxx11::stringbuf::str();
      parser_exception::parser_exception(this_00,&local_318,&local_338);
      __cxa_throw(this_00,&parser_exception::typeinfo,parser_exception::~parser_exception);
    }
    AbstractSyntaxNode::add_child(this->current_,pTVar7);
    local_338._M_dataplus._M_p._0_4_ = 0x22;
    match(&local_250,this,(Type *)&local_338);
    pTVar7 = &local_250;
  }
  Token::~Token(pTVar7);
  local_338._M_dataplus._M_p._0_4_ = 0xe;
  match(&local_300,this,(Type *)&local_338);
  Token::~Token(&local_300);
  this->current_ = this->current_->parent_;
  std::__cxx11::stringstream::~stringstream((stringstream *)&buffer);
  return;
}

Assistant:

void Parser::parse_array() {
    current_ = current_->add_child(Token::Type::kArray, forward_token());
    std::stringstream buffer;

    match(Token::Type::kLeftBracket);
    if (forward_token().type() == Token::Type::kIntegerLiteral) {
        current_->add_child(forward_token());
        match(Token::Type::kIntegerLiteral);
    } else if (forward_token().type() == Token::Type::kIdentity) {
        current_->add_child(forward_token());
        match(Token::Type::kIdentity);
    } else {
        buffer << "无效的标识符 \"" << forward_token().content() << "\", 数组括号中仅允许整数常量或变量(变量仅限用作左值)";
        throw parser_exception(forward_token().position(), buffer.str());
    }
    match(Token::Type::kRightBracket);

    current_ = current_->parent();
}